

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O0

void __thiscall OpenMD::Molecule::Molecule(Molecule *this,int globalIndex,MoleculeStamp *molStamp)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Molecule_00503650;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)0x26f62c);
  std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::vector
            ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)0x26f63f);
  std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::vector
            ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)0x26f652);
  std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::vector
            ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)0x26f665);
  std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::vector
            ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)0x26f678);
  std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>::vector
            ((vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_> *)0x26f68e);
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x26f6a4);
  std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>::vector
            ((vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_> *)0x26f6ba);
  std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>::vector
            ((vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> *)0x26f6d0
            );
  std::vector<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>::vector
            ((vector<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_> *)0x26f6e6
            );
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)0x26f6fc);
  std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>::
  vector((vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_> *)
         0x26f712);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)0x26f728);
  PropertyMap::PropertyMap((PropertyMap *)0x26f739);
  *(undefined1 *)(in_RDI + 0x30) = 0;
  in_RDI[0x31] = in_RDX;
  return;
}

Assistant:

Molecule::Molecule(int globalIndex, MoleculeStamp* molStamp) :
      globalIndex_(globalIndex), molStamp_ {molStamp},
      constrainTotalCharge_(false) {}